

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O3

int gray_convert_glyph_inner(PWorker worker)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  PVG_FT_Vector *pPVar5;
  PVG_FT_Vector *pPVar6;
  PVG_FT_Vector *to;
  long lVar7;
  PVG_FT_Vector *to_00;
  long lVar8;
  long ex;
  PVG_FT_Vector *control;
  long lVar9;
  PVG_FT_Vector *pPVar10;
  long lVar11;
  byte *pbVar12;
  bool bVar13;
  int error;
  int local_6c;
  
  iVar2 = _setjmp((__jmp_buf_tag *)worker->jump_buffer);
  if (iVar2 == 0) {
    if (0 < (worker->outline).n_contours) {
      uVar3 = 0;
      lVar7 = 0;
      do {
        iVar2 = (worker->outline).contours[lVar7];
        lVar11 = (long)iVar2;
        if (lVar11 < 0) {
LAB_0013b992:
          local_6c = -1;
          goto LAB_0013b96d;
        }
        pPVar10 = (worker->outline).points;
        pcVar1 = (worker->outline).tags;
        pPVar6 = pPVar10 + lVar11;
        pbVar12 = (byte *)(pcVar1 + uVar3);
        pPVar5 = pPVar10 + uVar3;
        lVar9 = pPVar10[uVar3].x;
        lVar8 = pPVar10[uVar3].y;
        if ((pcVar1[uVar3] & 3U) == 0) {
          if ((pcVar1[lVar11] & 3U) == 1) {
            pPVar6 = pPVar6 + -1;
            lVar8 = pPVar10[lVar11].y;
            lVar9 = pPVar10[lVar11].x;
          }
          else {
            lVar9 = (pPVar10[lVar11].x + lVar9) / 2;
            lVar8 = (pPVar10[lVar11].y + lVar8) / 2;
          }
          pPVar5 = pPVar5 + -1;
          pbVar12 = pbVar12 + -1;
        }
        else if ((pcVar1[uVar3] & 3U) == 2) goto LAB_0013b992;
        if (worker->invalid == 0) {
          gray_record_cell(worker);
        }
        lVar11 = worker->min_ex;
        lVar4 = lVar9 >> 6;
        if (worker->max_ex < lVar9 >> 6) {
          lVar4 = worker->max_ex;
        }
        ex = lVar11 + -1;
        if (lVar11 <= lVar4) {
          ex = lVar4;
        }
        worker->area = 0;
        worker->cover = 0;
        worker->invalid = 0;
        worker->ex = ex - lVar11;
        worker->ey = (lVar8 >> 6) - worker->min_ey;
        gray_set_cell(worker,ex,lVar8 >> 6);
        worker->x = lVar9 * 4;
        worker->y = lVar8 * 4;
        while (pPVar5 < pPVar6) {
          if ((pbVar12[1] & 3) == 0) {
            pPVar10 = (PVG_FT_Vector *)pPVar5[1].x;
            to_00 = (PVG_FT_Vector *)pPVar5[1].y;
            if (pPVar6 <= pPVar5 + 1) {
LAB_0013b90e:
              gray_render_conic(worker,pPVar10,to_00);
              goto LAB_0013b92b;
            }
            pbVar12 = pbVar12 + 2;
            pPVar5 = pPVar5 + 2;
            to = to_00;
            control = pPVar10;
            while( true ) {
              pPVar10 = (PVG_FT_Vector *)pPVar5->x;
              to_00 = (PVG_FT_Vector *)pPVar5->y;
              if ((*pbVar12 & 3) != 0) break;
              gray_render_conic(worker,control,to);
              pbVar12 = pbVar12 + 1;
              bVar13 = pPVar6 <= pPVar5;
              pPVar5 = pPVar5 + 1;
              to = to_00;
              control = pPVar10;
              if (bVar13) goto LAB_0013b90e;
            }
            if ((*pbVar12 & 3) != 1) goto LAB_0013b964;
            gray_render_conic(worker,control,to);
          }
          else if ((pbVar12[1] & 3) == 1) {
            pbVar12 = pbVar12 + 1;
            gray_render_line(worker,pPVar5[1].x << 2,pPVar5[1].y << 2);
            pPVar5 = pPVar5 + 1;
          }
          else {
            if ((pPVar6 < pPVar5 + 2) || ((pbVar12[2] & 3) != 2)) {
LAB_0013b964:
              local_6c = -1;
              goto LAB_0013b96d;
            }
            if (pPVar6 < pPVar5 + 3) {
              gray_render_cubic(worker,(PVG_FT_Vector *)pPVar5[1].x,(PVG_FT_Vector *)pPVar5[1].y,
                                (PVG_FT_Vector *)pPVar5[2].x);
              goto LAB_0013b92b;
            }
            pbVar12 = pbVar12 + 3;
            gray_render_cubic(worker,(PVG_FT_Vector *)pPVar5[1].x,(PVG_FT_Vector *)pPVar5[1].y,
                              (PVG_FT_Vector *)pPVar5[2].x);
            pPVar5 = pPVar5 + 3;
          }
        }
        gray_render_line(worker,lVar9 * 4,lVar8 * 4);
LAB_0013b92b:
        uVar3 = iVar2 + 1;
        lVar7 = lVar7 + 1;
      } while (lVar7 < (worker->outline).n_contours);
    }
    local_6c = 0;
LAB_0013b96d:
    if (worker->invalid == 0) {
      gray_record_cell(worker);
    }
  }
  else {
    local_6c = -4;
  }
  return local_6c;
}

Assistant:

static int
  gray_convert_glyph_inner( RAS_ARG )
  {
    volatile int  error = 0;

    if ( pvg_ft_setjmp( ras.jump_buffer ) == 0 )
    {
      error = PVG_FT_Outline_Decompose( &ras.outline, &ras );
      if ( !ras.invalid )
        gray_record_cell( RAS_VAR );
    }
    else
    {
      error = ErrRaster_Memory_Overflow;
    }

    return error;
  }